

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptBigInt.cpp
# Opt level: O3

void Js::JavascriptBigInt::AddAbsolute(JavascriptBigInt *pbi1,JavascriptBigInt *pbi2)

{
  ulong *puVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  code *pcVar4;
  bool bVar5;
  undefined4 *puVar6;
  unsigned_long *puVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  unsigned_long uVar13;
  
  uVar8 = pbi2->m_length;
  if (pbi1->m_length < uVar8) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptBigInt.cpp"
                                ,0x1c4,"(pbi1->m_length >= pbi2->m_length)",
                                "pbi1->m_length >= pbi2->m_length");
    if (!bVar5) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar6 = 0;
    uVar8 = pbi2->m_length;
  }
  if (uVar8 != 0) {
    puVar7 = (pbi1->m_digits).ptr;
    puVar2 = (pbi2->m_digits).ptr;
    uVar13 = 0;
    uVar8 = 0;
    do {
      uVar9 = uVar8;
      uVar3 = puVar7[uVar9];
      uVar8 = puVar2[uVar9];
      uVar11 = uVar8 + uVar3;
      bVar5 = CARRY8(uVar13,uVar11);
      uVar12 = uVar13 + uVar11;
      uVar13 = (ulong)CARRY8(uVar8,uVar3) + 1;
      if (!bVar5) {
        uVar13 = (ulong)CARRY8(uVar8,uVar3);
      }
      puVar7[uVar9] = uVar12;
      uVar8 = uVar9 + 1;
    } while (uVar8 < pbi2->m_length);
    uVar10 = pbi1->m_length;
    bVar5 = uVar11 < uVar3 || uVar12 < uVar11;
    if ((uVar8 < uVar10) && (uVar11 < uVar3 || uVar12 < uVar11)) {
      uVar9 = uVar9 + 2;
      do {
        puVar1 = puVar7 + (uVar9 - 1);
        bVar5 = CARRY8(*puVar1,uVar13);
        *puVar1 = *puVar1 + uVar13;
        uVar13 = (unsigned_long)bVar5;
        uVar10 = pbi1->m_length;
        if (uVar10 <= uVar9) break;
        uVar9 = uVar9 + 1;
      } while (bVar5);
    }
    if (bVar5) {
      if (pbi1->m_maxLength <= uVar10) {
        Resize(pbi1,uVar10 + 1);
        puVar7 = (pbi1->m_digits).ptr;
        uVar10 = pbi1->m_length;
      }
      pbi1->m_length = uVar10 + 1;
      puVar7[uVar10] = uVar13;
    }
  }
  return;
}

Assistant:

void JavascriptBigInt::AddAbsolute(JavascriptBigInt * pbi1, JavascriptBigInt * pbi2)
    {
        Assert(pbi1->m_length >= pbi2->m_length);
        digit_t carryDigit = 0;
        digit_t *pDigit1 = pbi1->m_digits;
        digit_t *pDigit2 = pbi2->m_digits;
        digit_t i = 0;

        for (; i < pbi2->m_length; i++)
        {
            digit_t tempCarryDigit = 0;
            pDigit1[i] = JavascriptBigInt::AddDigit(pDigit1[i], pDigit2[i], &tempCarryDigit);
            pDigit1[i] = JavascriptBigInt::AddDigit(pDigit1[i], carryDigit, &tempCarryDigit);
            carryDigit = tempCarryDigit;
        }

        for (; i < pbi1->m_length && carryDigit > 0; i++)
        {
            digit_t tempCarryDigit = 0;
            pDigit1[i] = JavascriptBigInt::AddDigit(pDigit1[i], carryDigit, &tempCarryDigit);
            carryDigit = tempCarryDigit;
        }

        if (0 < carryDigit) // length increase by 1
        {
            if (pbi1->m_length >= pbi1->m_maxLength)
            {
                pbi1->Resize(pbi1->m_length + 1);
            }
            pbi1->m_digits[pbi1->m_length++] = carryDigit;
        }
    }